

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pXXX_YYY.cpp
# Opt level: O2

void pXXX_YYY(void)

{
  initializer_list<int> __l;
  allocator local_61;
  string problem_no;
  list<int,_std::allocator<int>_> files_to_run;
  string base_path;
  
  base_path._M_dataplus._M_p = (pointer)0x200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&base_path;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            (&files_to_run,__l,(allocator_type *)&problem_no);
  std::__cxx11::string::string
            ((string *)&base_path,"src/codewars/easy_puzzles",(allocator *)&problem_no);
  std::__cxx11::string::string((string *)&problem_no,"pXXX_YYY",&local_61);
  string_in_out_testing_v2(&base_path,&problem_no,&files_to_run,pXXX_main);
  std::__cxx11::string::~string((string *)&problem_no);
  std::__cxx11::string::~string((string *)&base_path);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&files_to_run.super__List_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void pXXX_YYY() {
    list<int> files_to_run = {1, 2};  // TODO: Specify which test-sets you want to run or leave empty to run all test-files found)
    const string base_path = "src/codewars/easy_puzzles";  // TODO: Change if necessary
    const string problem_no = "pXXX_YYY";
    string_in_out_testing_v2(base_path, problem_no, files_to_run, pXXX_main);
}